

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetBorderRoutersInNetwork
          (Registry *this,uint64_t aXpan,BorderRouterArray *aRet)

{
  int iVar1;
  Status local_215;
  Status status;
  undefined1 local_208 [8];
  BorderRouter pred;
  Network nwk;
  BorderRouterArray *aRet_local;
  uint64_t aXpan_local;
  Registry *this_local;
  
  Network::Network((Network *)&pred.mAgent.mPresentFlags);
  BorderRouter::BorderRouter((BorderRouter *)local_208);
  local_215 = GetNetworkByXpan(this,aXpan,(Network *)&pred.mAgent.mPresentFlags);
  if (local_215 == kSuccess) {
    pred._vptr_BorderRouter._4_4_ = pred.mAgent.mPresentFlags;
    iVar1 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,local_208,aRet);
    local_215 = anon_unknown_0::MapStatus((Status)iVar1);
  }
  BorderRouter::~BorderRouter((BorderRouter *)local_208);
  Network::~Network((Network *)&pred.mAgent.mPresentFlags);
  return local_215;
}

Assistant:

Registry::Status Registry::GetBorderRoutersInNetwork(uint64_t aXpan, BorderRouterArray &aRet)
{
    Network          nwk;
    BorderRouter     pred;
    Registry::Status status = GetNetworkByXpan(aXpan, nwk);

    VerifyOrExit(status == Registry::Status::kSuccess);
    pred.mNetworkId = nwk.mId;
    status          = MapStatus(mStorage->Lookup(pred, aRet));
exit:
    return status;
}